

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::getIntegerFuncCaseName_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  long lVar1;
  char *__s;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  allocator<char> local_61;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  __s = glu::getDataTypeName((DataType)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_61);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getIntegerFuncCaseName (glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
{
	return string(glu::getDataTypeName(baseType)) + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType);
}